

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O0

void __thiscall MPLSParser::parse(MPLSParser *this,uint8_t *buffer,int len)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ostringstream ss;
  BitStreamException *anon_var_0;
  int i;
  int extensionData_start_address;
  int playListMark_start_address;
  int playList_start_address;
  char version_number [5];
  char type_indicator [5];
  undefined1 local_40 [8];
  BitStreamReader reader;
  int len_local;
  uint8_t *buffer_local;
  MPLSParser *this_local;
  
  reader.m_bitLeft = len;
  BitStreamReader::BitStreamReader((BitStreamReader *)local_40);
  BitStreamReader::setBuffer((BitStreamReader *)local_40,buffer,buffer + (int)reader.m_bitLeft);
  CLPIStreamInfo::readString
            ((char *)((long)&playList_start_address + 3),(BitStreamReader *)local_40,4);
  CLPIStreamInfo::readString
            ((char *)((long)&playListMark_start_address + 2),(BitStreamReader *)local_40,4);
  iVar1 = BitStreamReader::getBits<int>((BitStreamReader *)local_40,0x20);
  iVar2 = BitStreamReader::getBits<int>((BitStreamReader *)local_40,0x20);
  iVar3 = BitStreamReader::getBits<int>((BitStreamReader *)local_40,0x20);
  for (anon_var_0._0_4_ = 0; (int)anon_var_0 < 5; anon_var_0._0_4_ = (int)anon_var_0 + 1) {
    BitStreamReader::skipBits((BitStreamReader *)local_40,0x20);
  }
  AppInfoPlayList(this,(BitStreamReader *)local_40);
  parsePlayList(this,buffer + iVar1,reader.m_bitLeft - iVar1);
  parsePlayListMark(this,buffer + iVar2,reader.m_bitLeft - iVar2);
  if (iVar3 != 0) {
    parseExtensionData(this,buffer + iVar3,buffer + (int)reader.m_bitLeft);
  }
  return;
}

Assistant:

void MPLSParser::parse(uint8_t* buffer, const int len)
{
    BitStreamReader reader{};
    try
    {
        reader.setBuffer(buffer, buffer + len);
        char type_indicator[5];
        char version_number[5];
        CLPIStreamInfo::readString(type_indicator, reader, 4);
        CLPIStreamInfo::readString(version_number, reader, 4);
        const int playList_start_address = reader.getBits<int>(32);
        const int playListMark_start_address = reader.getBits<int>(32);
        const int extensionData_start_address = reader.getBits<int>(32);
        for (int i = 0; i < 5; i++) reader.skipBits(32);  // reserved_for_future_use
        AppInfoPlayList(reader);
        parsePlayList(buffer + playList_start_address, len - playList_start_address);
        parsePlayListMark(buffer + playListMark_start_address, len - playListMark_start_address);

        if (extensionData_start_address)
        {
            parseExtensionData(buffer + extensionData_start_address, buffer + len);
        }
    }
    catch (BitStreamException&)
    {
        THROW(ERR_COMMON, "Can't parse media playlist file: unexpected end of data")
    }
}